

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall sznet::net::Buffer::makeSpace(Buffer *this,size_t len)

{
  if ((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish +
      (this->m_readerIndex -
      (long)((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + this->m_writerIndex)) <
      (pointer)(this->m_nCheapPrepend + len)) {
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,this->m_writerIndex + len);
    this->m_wrapSize =
         (ulong)(((long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                 (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) * 3) >> 2;
    return;
  }
  if (this->m_nCheapPrepend < this->m_readerIndex) {
    wrapBuffer(this);
    return;
  }
  __assert_fail("m_nCheapPrepend < m_readerIndex",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                ,0x18e,"void sznet::net::Buffer::makeSpace(size_t)");
}

Assistant:

void makeSpace(size_t len)
	{
		if (writableBytes() + prependableBytes() < len + m_nCheapPrepend)
		{
			// ������ȷʵ������
			// FIXME: move readable data
			m_buffer.resize(m_writerIndex + len);
			m_wrapSize = m_buffer.capacity() * 3 / 4;
		}
		else
		{
			// ����
			assert(m_nCheapPrepend < m_readerIndex);
			wrapBuffer();
		}
	}